

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O1

int psbt_set_global_tx(wally_psbt *psbt,wally_tx *tx,_Bool do_clone)

{
  int iVar1;
  wally_psbt_input *ptr;
  wally_psbt_output *ptr_00;
  size_t sVar2;
  wally_tx_witness_stack **ppwVar3;
  wally_tx *new_tx;
  wally_tx *local_30;
  
  local_30 = (wally_tx *)0x0;
  iVar1 = -2;
  if ((((psbt != (wally_psbt *)0x0) && (psbt->tx == (wally_tx *)0x0)) && (psbt->num_inputs == 0)) &&
     ((tx != (wally_tx *)0x0 && (psbt->num_outputs == 0)))) {
    sVar2 = tx->num_inputs;
    if (sVar2 != 0) {
      ppwVar3 = &tx->inputs->witness;
      do {
        if (ppwVar3[-2] != (wally_tx_witness_stack *)0x0) {
          return -2;
        }
        if (*ppwVar3 != (wally_tx_witness_stack *)0x0) {
          return -2;
        }
        ppwVar3 = ppwVar3 + 0x1a;
        sVar2 = sVar2 - 1;
      } while (sVar2 != 0);
    }
    if ((do_clone) && (iVar1 = wally_tx_clone_alloc(tx,0,&local_30), iVar1 != 0)) {
      return iVar1;
    }
    if (psbt->inputs_allocation_len < tx->num_inputs) {
      ptr = (wally_psbt_input *)wally_calloc(tx->num_inputs * 0x110);
    }
    else {
      ptr = (wally_psbt_input *)0x0;
    }
    if (psbt->outputs_allocation_len < tx->num_outputs) {
      ptr_00 = (wally_psbt_output *)wally_calloc(tx->num_outputs * 0xd0);
    }
    else {
      ptr_00 = (wally_psbt_output *)0x0;
    }
    if (((psbt->inputs_allocation_len < tx->num_inputs) && (ptr == (wally_psbt_input *)0x0)) ||
       ((psbt->outputs_allocation_len < tx->num_outputs && (ptr_00 == (wally_psbt_output *)0x0)))) {
      wally_free(ptr);
      wally_free(ptr_00);
      wally_tx_free(local_30);
      iVar1 = -3;
    }
    else {
      if (ptr != (wally_psbt_input *)0x0) {
        wally_free(psbt->inputs);
        psbt->inputs = ptr;
        psbt->inputs_allocation_len = tx->num_inputs;
      }
      if (ptr_00 != (wally_psbt_output *)0x0) {
        wally_free(psbt->outputs);
        psbt->outputs = ptr_00;
        psbt->outputs_allocation_len = tx->num_outputs;
      }
      psbt->num_inputs = tx->num_inputs;
      psbt->num_outputs = tx->num_outputs;
      if (do_clone) {
        tx = local_30;
      }
      psbt->tx = tx;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

static int psbt_set_global_tx(struct wally_psbt *psbt, struct wally_tx *tx, bool do_clone)
{
    struct wally_tx *new_tx = NULL;
    struct wally_psbt_input *new_inputs = NULL;
    struct wally_psbt_output *new_outputs = NULL;
    size_t i;
    int ret;

    if (!psbt || psbt->tx || psbt->num_inputs || psbt->num_outputs || !tx)
        return WALLY_EINVAL; /* PSBT must be completely empty */

    for (i = 0; i < tx->num_inputs; ++i)
        if (tx->inputs[i].script || tx->inputs[i].witness)
            return WALLY_EINVAL; /* tx mustn't have scriptSigs or witnesses */

    if (do_clone && (ret = tx_clone_alloc(tx, &new_tx)) != WALLY_OK)
        return ret;

    if (psbt->inputs_allocation_len < tx->num_inputs)
        new_inputs = wally_calloc(tx->num_inputs * sizeof(struct wally_psbt_input));

    if (psbt->outputs_allocation_len < tx->num_outputs)
        new_outputs = wally_calloc(tx->num_outputs * sizeof(struct wally_psbt_output));

    if ((psbt->inputs_allocation_len < tx->num_inputs && !new_inputs) ||
        (psbt->outputs_allocation_len < tx->num_outputs && !new_outputs)) {
        wally_free(new_inputs);
        wally_free(new_outputs);
        wally_tx_free(new_tx);
        return WALLY_ENOMEM;
    }

    if (new_inputs) {
        wally_free(psbt->inputs);
        psbt->inputs = new_inputs;
        psbt->inputs_allocation_len = tx->num_inputs;
    }
    if (new_outputs) {
        wally_free(psbt->outputs);
        psbt->outputs = new_outputs;
        psbt->outputs_allocation_len = tx->num_outputs;
    }
    psbt->num_inputs = tx->num_inputs;
    psbt->num_outputs = tx->num_outputs;
    psbt->tx = do_clone ? new_tx : tx;
    return WALLY_OK;
}